

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnode_after.c
# Opt level: O0

mpt_node * mpt_gnode_after(mpt_node *position,mpt_node *insert)

{
  int *piVar1;
  mpt_node *insert_local;
  mpt_node *position_local;
  
  if (insert == (mpt_node *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0xe;
    position_local = (mpt_node *)0x0;
  }
  else {
    position_local = insert;
    if ((position != (mpt_node *)0x0) && (insert != position)) {
      insert->prev = position;
      insert->next = position->next;
      position->next = insert;
      insert->parent = position->parent;
      if (insert->next != (mpt_node *)0x0) {
        insert->next->prev = insert;
      }
    }
  }
  return position_local;
}

Assistant:

extern MPT_STRUCT(node) *mpt_gnode_after(MPT_STRUCT(node) *position, MPT_STRUCT(node) *insert)
{
	if (!insert) {
		errno = EFAULT;
		return 0;
	}
	
	/* no previous node, avoid self-reference */
	if (!position || insert == position) {
		return insert;
	}
	/* avoid self-reference */
	insert->prev = position;
	insert->next = position->next;
	position->next = insert;
	
	insert->parent = position->parent;
	
	if ((position = insert->next)) {
		position->prev = insert;
	}
	return insert;
}